

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattr_set.c
# Opt level: O3

int lattr_pset(uchar *val,mpt_convertable *src,int *def)

{
  int iVar1;
  uint8_t sym;
  int32_t tmp;
  byte local_1d;
  uint local_1c;
  
  if (src != (mpt_convertable *)0x0) {
    iVar1 = (*src->_vptr->convert)(src,0x79,&local_1d);
    if (iVar1 < 0) {
      local_1c = (uint)*val;
      iVar1 = (*src->_vptr->convert)(src,0x69,&local_1c);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (0xff < local_1c) {
        return -2;
      }
      local_1d = (byte)local_1c;
    }
    if (iVar1 != 0) {
      if ((int)(uint)local_1d < def[1]) {
        return -2;
      }
      if ((int)(uint)local_1d <= def[2]) {
        *val = local_1d;
        return 0;
      }
      return -2;
    }
  }
  *val = (uchar)*def;
  return 0;
}

Assistant:

static int lattr_pset(unsigned char *val, MPT_INTERFACE(convertable) *src, int def[3])
{
	int len;
	uint8_t sym;
	
	if (!src) {
		*val = def[0];
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'y', &sym)) < 0) {
		int32_t tmp = *val;
		if ((len = src->_vptr->convert(src, 'i', &tmp)) < 0) {
			return len;
		}
		if (tmp < 0 || tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		sym = tmp;
	}
	if (!len) {
		*val = def[0];
		return 0;
	}
	if (sym < def[1] || sym > def[2]) {
		return MPT_ERROR(BadValue);
	}
	*val = sym;
	
	return 0;
}